

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

int4 __thiscall ActionExtraPopSetup::apply(ActionExtraPopSetup *this,Funcdata *data)

{
  int4 s;
  AddrSpace *pAVar1;
  pointer ppFVar2;
  FuncCallSpecs *pFVar3;
  int iVar4;
  undefined4 extraout_var;
  PcodeOp *op;
  Varnode *pVVar6;
  int4 i;
  long lVar7;
  Address sb_addr;
  undefined8 *puVar5;
  
  pAVar1 = this->stackspace;
  if (pAVar1 != (AddrSpace *)0x0) {
    iVar4 = (*pAVar1->_vptr_AddrSpace[3])(pAVar1,0);
    puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar4);
    sb_addr.base = (AddrSpace *)*puVar5;
    sb_addr.offset = puVar5[1];
    s = *(int4 *)(puVar5 + 2);
    for (lVar7 = 0;
        ppFVar2 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar7 < (int)((ulong)((long)(data->qlst).
                                    super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2) >> 3
                     ); lVar7 = lVar7 + 1) {
      pFVar3 = ppFVar2[lVar7];
      if ((pFVar3->super_FuncProto).extrapop != 0) {
        op = Funcdata::newOp(data,2,&(pFVar3->op->start).pc);
        Funcdata::newVarnodeOut(data,s,&sb_addr,op);
        pVVar6 = Funcdata::newVarnode(data,s,&sb_addr,(Datatype *)0x0);
        Funcdata::opSetInput(data,op,pVVar6,0);
        iVar4 = (pFVar3->super_FuncProto).extrapop;
        if (iVar4 == 0x8000) {
          Funcdata::opSetOpcode(data,op,CPUI_INDIRECT);
          pVVar6 = Funcdata::newVarnodeIop(data,pFVar3->op);
          Funcdata::opSetInput(data,op,pVVar6,1);
          Funcdata::opInsertBefore(data,op,pFVar3->op);
        }
        else {
          pFVar3->effective_extrapop = iVar4;
          Funcdata::opSetOpcode(data,op,CPUI_INT_ADD);
          pVVar6 = Funcdata::newConstant(data,s,(long)(pFVar3->super_FuncProto).extrapop);
          Funcdata::opSetInput(data,op,pVVar6,1);
          Funcdata::opInsertAfter(data,op,pFVar3->op);
        }
      }
    }
  }
  return 0;
}

Assistant:

int4 ActionExtraPopSetup::apply(Funcdata &data)

{
  FuncCallSpecs *fc;
  PcodeOp *op;

  if (stackspace == (AddrSpace *)0) return 0; // No stack to speak of
  const VarnodeData &point(stackspace->getSpacebase(0));
  Address sb_addr(point.space,point.offset);
  int4 sb_size = point.size;
  
  for(int4 i=0;i<data.numCalls();++i) {
    fc = data.getCallSpecs(i);
    if (fc->getExtraPop() == 0) continue; // Stack pointer is undisturbed
    op = data.newOp(2,fc->getOp()->getAddr());
    data.newVarnodeOut(sb_size,sb_addr,op);
    data.opSetInput(op,data.newVarnode(sb_size,sb_addr),0);
    if (fc->getExtraPop() != ProtoModel::extrapop_unknown) { // We know exactly how stack pointer is changed
      fc->setEffectiveExtraPop(fc->getExtraPop());
      data.opSetOpcode(op,CPUI_INT_ADD);
      data.opSetInput(op,data.newConstant(sb_size,fc->getExtraPop()),1);
      data.opInsertAfter(op,fc->getOp());
    }
    else {			// We don't know exactly, so we create INDIRECT
      data.opSetOpcode(op,CPUI_INDIRECT);
      data.opSetInput(op,data.newVarnodeIop(fc->getOp()),1);
      data.opInsertBefore(op,fc->getOp());
    }
  }
  return 0;
}